

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

char * get_key_name(wchar_t key)

{
  switch(key) {
  case L'Ā':
    return "ESCAPE";
  case L'ā':
    return "ENTER";
  case L'Ă':
    return "TAB";
  case L'ă':
    return "BACKSPACE";
  case L'Ą':
    return "INSERT";
  case L'ą':
    return "DELETE";
  case L'Ć':
    return "RIGHT";
  case L'ć':
    return "LEFT";
  case L'Ĉ':
    return "DOWN";
  case L'ĉ':
    return "UP";
  case L'Ċ':
    return "PAGE UP";
  case L'ċ':
    return "PAGE DOWN";
  case L'Č':
    return "HOME";
  case L'č':
    return "END";
  case L'Ď':
  case L'ď':
  case L'Đ':
  case L'đ':
  case L'Ē':
  case L'ē':
  case L'Ĕ':
  case L'ĕ':
  case L'Ė':
  case L'ė':
  case L'ĝ':
  case L'Ğ':
  case L'ğ':
  case L'Ġ':
  case L'ġ':
  case L'Ļ':
  case L'ļ':
  case L'Ľ':
  case L'ľ':
  case L'Ŀ':
  case L'ő':
  case L'Œ':
  case L'œ':
    goto switchD_001149d0_caseD_10e;
  case L'Ę':
    return "CAPS LOCK";
  case L'ę':
    return "SCROLL LOCK";
  case L'Ě':
    return "NUM LOCK";
  case L'ě':
    return "PRINT SCREEN";
  case L'Ĝ':
    return "PAUSE";
  case L'Ģ':
    return "F1";
  case L'ģ':
    return "F2";
  case L'Ĥ':
    return "F3";
  case L'ĥ':
    return "F4";
  case L'Ħ':
    return "F5";
  case L'ħ':
    return "F6";
  case L'Ĩ':
    return "F7";
  case L'ĩ':
    return "F8";
  case L'Ī':
    return "F9";
  case L'ī':
    return "F10";
  case L'Ĭ':
    return "F11";
  case L'ĭ':
    return "F12";
  case L'Į':
    return "F13";
  case L'į':
    return "F14";
  case L'İ':
    return "F15";
  case L'ı':
    return "F16";
  case L'Ĳ':
    return "F17";
  case L'ĳ':
    return "F18";
  case L'Ĵ':
    return "F19";
  case L'ĵ':
    return "F20";
  case L'Ķ':
    return "F21";
  case L'ķ':
    return "F22";
  case L'ĸ':
    return "F23";
  case L'Ĺ':
    return "F24";
  case L'ĺ':
    return "F25";
  case L'ŀ':
    return "KEYPAD 0";
  case L'Ł':
    return "KEYPAD 1";
  case L'ł':
    return "KEYPAD 2";
  case L'Ń':
    return "KEYPAD 3";
  case L'ń':
    return "KEYPAD 4";
  case L'Ņ':
    return "KEYPAD 5";
  case L'ņ':
    return "KEYPAD 6";
  case L'Ň':
    return "KEYPAD 7";
  case L'ň':
    return "KEYPAD 8";
  case L'ŉ':
    return "KEYPAD 9";
  case L'Ŋ':
    return "KEYPAD DECIMAL";
  case L'ŋ':
    return "KEYPAD DIVIDE";
  case L'Ō':
    return "KEYPAD MULTPLY";
  case L'ō':
    return "KEYPAD SUBTRACT";
  case L'Ŏ':
    return "KEYPAD ADD";
  case L'ŏ':
    return "KEYPAD ENTER";
  case L'Ő':
    return "KEYPAD EQUAL";
  case L'Ŕ':
    return "LEFT SHIFT";
  case L'ŕ':
    return "LEFT CONTROL";
  case L'Ŗ':
    return "LEFT ALT";
  case L'ŗ':
    return "LEFT SUPER";
  case L'Ř':
    return "RIGHT SHIFT";
  case L'ř':
    return "RIGHT CONTROL";
  case L'Ś':
    return "RIGHT ALT";
  case L'ś':
    return "RIGHT SUPER";
  case L'Ŝ':
    return "MENU";
  default:
    switch(key) {
    case L' ':
      return "SPACE";
    case L'!':
    case L'\"':
    case L'#':
    case L'$':
    case L'%':
    case L'&':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L':':
    case L'<':
    case L'>':
    case L'?':
    case L'@':
    case L'^':
    case L'_':
      break;
    case L'\'':
      return "APOSTROPHE";
    case L',':
      return "COMMA";
    case L'-':
      return "MINUS";
    case L'.':
      return "PERIOD";
    case L'/':
      return "SLASH";
    case L'0':
      return "0";
    case L'1':
      return "1";
    case L'2':
      return "2";
    case L'3':
      return "3";
    case L'4':
      return "4";
    case L'5':
      return "5";
    case L'6':
      return "6";
    case L'7':
      return "7";
    case L'8':
      return "8";
    case L'9':
      return "9";
    case L';':
      return "SEMICOLON";
    case L'=':
      return "EQUAL";
    case L'A':
      return "A";
    case L'B':
      return "B";
    case L'C':
      return "C";
    case L'D':
      return "D";
    case L'E':
      return "E";
    case L'F':
      return "F";
    case L'G':
      return "G";
    case L'H':
      return "H";
    case L'I':
      return "I";
    case L'J':
      return "J";
    case L'K':
      return "K";
    case L'L':
      return "L";
    case L'M':
      return "M";
    case L'N':
      return "N";
    case L'O':
      return "O";
    case L'P':
      return "P";
    case L'Q':
      return "Q";
    case L'R':
      return "R";
    case L'S':
      return "S";
    case L'T':
      return "T";
    case L'U':
      return "U";
    case L'V':
      return "V";
    case L'W':
      return "W";
    case L'X':
      return "X";
    case L'Y':
      return "Y";
    case L'Z':
      return "Z";
    case L'[':
      return "LEFT BRACKET";
    case L'\\':
      return "BACKSLASH";
    case L']':
      return "RIGHT BRACKET";
    case L'`':
      return "GRAVE ACCENT";
    default:
      if (key == L'¡') {
        return "WORLD 1";
      }
      if (key == L'¢') {
        return "WORLD 2";
      }
    }
switchD_001149d0_caseD_10e:
    return "UNKNOWN";
  }
}

Assistant:

static const char* get_key_name(int key)
{
    switch (key)
    {
        // Printable keys
        case GLFW_KEY_A:            return "A";
        case GLFW_KEY_B:            return "B";
        case GLFW_KEY_C:            return "C";
        case GLFW_KEY_D:            return "D";
        case GLFW_KEY_E:            return "E";
        case GLFW_KEY_F:            return "F";
        case GLFW_KEY_G:            return "G";
        case GLFW_KEY_H:            return "H";
        case GLFW_KEY_I:            return "I";
        case GLFW_KEY_J:            return "J";
        case GLFW_KEY_K:            return "K";
        case GLFW_KEY_L:            return "L";
        case GLFW_KEY_M:            return "M";
        case GLFW_KEY_N:            return "N";
        case GLFW_KEY_O:            return "O";
        case GLFW_KEY_P:            return "P";
        case GLFW_KEY_Q:            return "Q";
        case GLFW_KEY_R:            return "R";
        case GLFW_KEY_S:            return "S";
        case GLFW_KEY_T:            return "T";
        case GLFW_KEY_U:            return "U";
        case GLFW_KEY_V:            return "V";
        case GLFW_KEY_W:            return "W";
        case GLFW_KEY_X:            return "X";
        case GLFW_KEY_Y:            return "Y";
        case GLFW_KEY_Z:            return "Z";
        case GLFW_KEY_1:            return "1";
        case GLFW_KEY_2:            return "2";
        case GLFW_KEY_3:            return "3";
        case GLFW_KEY_4:            return "4";
        case GLFW_KEY_5:            return "5";
        case GLFW_KEY_6:            return "6";
        case GLFW_KEY_7:            return "7";
        case GLFW_KEY_8:            return "8";
        case GLFW_KEY_9:            return "9";
        case GLFW_KEY_0:            return "0";
        case GLFW_KEY_SPACE:        return "SPACE";
        case GLFW_KEY_MINUS:        return "MINUS";
        case GLFW_KEY_EQUAL:        return "EQUAL";
        case GLFW_KEY_LEFT_BRACKET: return "LEFT BRACKET";
        case GLFW_KEY_RIGHT_BRACKET: return "RIGHT BRACKET";
        case GLFW_KEY_BACKSLASH:    return "BACKSLASH";
        case GLFW_KEY_SEMICOLON:    return "SEMICOLON";
        case GLFW_KEY_APOSTROPHE:   return "APOSTROPHE";
        case GLFW_KEY_GRAVE_ACCENT: return "GRAVE ACCENT";
        case GLFW_KEY_COMMA:        return "COMMA";
        case GLFW_KEY_PERIOD:       return "PERIOD";
        case GLFW_KEY_SLASH:        return "SLASH";
        case GLFW_KEY_WORLD_1:      return "WORLD 1";
        case GLFW_KEY_WORLD_2:      return "WORLD 2";

        // Function keys
        case GLFW_KEY_ESCAPE:       return "ESCAPE";
        case GLFW_KEY_F1:           return "F1";
        case GLFW_KEY_F2:           return "F2";
        case GLFW_KEY_F3:           return "F3";
        case GLFW_KEY_F4:           return "F4";
        case GLFW_KEY_F5:           return "F5";
        case GLFW_KEY_F6:           return "F6";
        case GLFW_KEY_F7:           return "F7";
        case GLFW_KEY_F8:           return "F8";
        case GLFW_KEY_F9:           return "F9";
        case GLFW_KEY_F10:          return "F10";
        case GLFW_KEY_F11:          return "F11";
        case GLFW_KEY_F12:          return "F12";
        case GLFW_KEY_F13:          return "F13";
        case GLFW_KEY_F14:          return "F14";
        case GLFW_KEY_F15:          return "F15";
        case GLFW_KEY_F16:          return "F16";
        case GLFW_KEY_F17:          return "F17";
        case GLFW_KEY_F18:          return "F18";
        case GLFW_KEY_F19:          return "F19";
        case GLFW_KEY_F20:          return "F20";
        case GLFW_KEY_F21:          return "F21";
        case GLFW_KEY_F22:          return "F22";
        case GLFW_KEY_F23:          return "F23";
        case GLFW_KEY_F24:          return "F24";
        case GLFW_KEY_F25:          return "F25";
        case GLFW_KEY_UP:           return "UP";
        case GLFW_KEY_DOWN:         return "DOWN";
        case GLFW_KEY_LEFT:         return "LEFT";
        case GLFW_KEY_RIGHT:        return "RIGHT";
        case GLFW_KEY_LEFT_SHIFT:   return "LEFT SHIFT";
        case GLFW_KEY_RIGHT_SHIFT:  return "RIGHT SHIFT";
        case GLFW_KEY_LEFT_CONTROL: return "LEFT CONTROL";
        case GLFW_KEY_RIGHT_CONTROL: return "RIGHT CONTROL";
        case GLFW_KEY_LEFT_ALT:     return "LEFT ALT";
        case GLFW_KEY_RIGHT_ALT:    return "RIGHT ALT";
        case GLFW_KEY_TAB:          return "TAB";
        case GLFW_KEY_ENTER:        return "ENTER";
        case GLFW_KEY_BACKSPACE:    return "BACKSPACE";
        case GLFW_KEY_INSERT:       return "INSERT";
        case GLFW_KEY_DELETE:       return "DELETE";
        case GLFW_KEY_PAGE_UP:      return "PAGE UP";
        case GLFW_KEY_PAGE_DOWN:    return "PAGE DOWN";
        case GLFW_KEY_HOME:         return "HOME";
        case GLFW_KEY_END:          return "END";
        case GLFW_KEY_KP_0:         return "KEYPAD 0";
        case GLFW_KEY_KP_1:         return "KEYPAD 1";
        case GLFW_KEY_KP_2:         return "KEYPAD 2";
        case GLFW_KEY_KP_3:         return "KEYPAD 3";
        case GLFW_KEY_KP_4:         return "KEYPAD 4";
        case GLFW_KEY_KP_5:         return "KEYPAD 5";
        case GLFW_KEY_KP_6:         return "KEYPAD 6";
        case GLFW_KEY_KP_7:         return "KEYPAD 7";
        case GLFW_KEY_KP_8:         return "KEYPAD 8";
        case GLFW_KEY_KP_9:         return "KEYPAD 9";
        case GLFW_KEY_KP_DIVIDE:    return "KEYPAD DIVIDE";
        case GLFW_KEY_KP_MULTIPLY:  return "KEYPAD MULTPLY";
        case GLFW_KEY_KP_SUBTRACT:  return "KEYPAD SUBTRACT";
        case GLFW_KEY_KP_ADD:       return "KEYPAD ADD";
        case GLFW_KEY_KP_DECIMAL:   return "KEYPAD DECIMAL";
        case GLFW_KEY_KP_EQUAL:     return "KEYPAD EQUAL";
        case GLFW_KEY_KP_ENTER:     return "KEYPAD ENTER";
        case GLFW_KEY_PRINT_SCREEN: return "PRINT SCREEN";
        case GLFW_KEY_NUM_LOCK:     return "NUM LOCK";
        case GLFW_KEY_CAPS_LOCK:    return "CAPS LOCK";
        case GLFW_KEY_SCROLL_LOCK:  return "SCROLL LOCK";
        case GLFW_KEY_PAUSE:        return "PAUSE";
        case GLFW_KEY_LEFT_SUPER:   return "LEFT SUPER";
        case GLFW_KEY_RIGHT_SUPER:  return "RIGHT SUPER";
        case GLFW_KEY_MENU:         return "MENU";

        default:                    return "UNKNOWN";
    }
}